

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O2

string * __thiscall
despot::BridgeState::text_abi_cxx11_(string *__return_storage_ptr__,BridgeState *this)

{
  string local_30;
  
  to_string<int>(&local_30,this->position);
  std::operator+(__return_storage_ptr__,"Man at ",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string BridgeState::text() const {
	return "Man at " + to_string(position);
}